

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

char ** apprun_read_lines(FILE *fp)

{
  size_t __ptr;
  __ssize_t _Var1;
  int local_3c;
  int i;
  char **old_array;
  ssize_t read;
  size_t len;
  char **result;
  int count;
  int array_len;
  FILE *fp_local;
  
  result._4_4_ = 0x400;
  result._0_4_ = 0;
  _count = (FILE *)fp;
  len = (size_t)apprun_string_list_alloc(0x400);
  if (_count != (FILE *)0x0) {
    read = 0;
    while (_Var1 = getline((char **)(len + (long)(int)(uint)result * 8),(size_t *)&read,_count),
          __ptr = len, _Var1 != -1) {
      if ((0 < _Var1) &&
         (*(char *)(*(long *)(len + (long)(int)(uint)result * 8) + _Var1 + -1) == '\n')) {
        *(undefined1 *)(*(long *)(len + (long)(int)(uint)result * 8) + _Var1 + -1) = 0;
      }
      result._0_4_ = (uint)result + 1;
      if ((uint)result == result._4_4_) {
        result._4_4_ = result._4_4_ << 1;
        len = (size_t)apprun_string_list_alloc(result._4_4_);
        for (local_3c = 0; local_3c < (int)(uint)result; local_3c = local_3c + 1) {
          *(char **)(len + (long)local_3c * 8) = *(char **)(__ptr + (long)local_3c * 8);
        }
        free((void *)__ptr);
      }
    }
  }
  *(undefined8 *)(len + (long)(int)(uint)result * 8) = 0;
  return (char **)len;
}

Assistant:

char **apprun_read_lines(FILE *fp) {
    int array_len = 1024;
    int count = 0;
    char **result = apprun_string_list_alloc(array_len);

    if (fp) {
        size_t len = 0;
        ssize_t read;

        while ((read = getline(&result[count], &len, fp)) != -1) {
            if (read > 0 && result[count][read - 1] == '\n')
                result[count][read - 1] = 0;
            count++;
            if (count == array_len) {
                array_len = array_len * 2;
                char **old_array = result;

                result = apprun_string_list_alloc(array_len);
                for (int i = 0; i < count; i++)
                    result[i] = old_array[i];

                free(old_array);
            }
        }
    }

    result[count] = NULL;

    return result;
}